

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportDirWrapper.cpp
# Opt level: O1

void * __thiscall ImportedFuncWrapper::getValuePtr(ImportedFuncWrapper *this,FieldID fId)

{
  Executable *pEVar1;
  ExeNodeWrapper *pEVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar4;
  long lVar5;
  bool bVar6;
  bool isOk;
  char local_29;
  
  if ((this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.parentNode ==
      (ExeNodeWrapper *)0x0) {
    return (void *)0x0;
  }
  pEVar1 = (this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
           super_ExeElementWrapper.m_Exe;
  if (pEVar1 == (Executable *)0x0) {
    bVar6 = false;
  }
  else {
    iVar3 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xb])();
    bVar6 = iVar3 == 0x40;
  }
  pEVar2 = (this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.parentNode;
  iVar3 = (*(pEVar2->super_ExeElementWrapper).super_AbstractByteBuffer._vptr_AbstractByteBuffer
            [0x1c])(pEVar2,(long)fId,0xffffffffffffffff,&local_29);
  if (local_29 == '\x01') {
    lVar5 = (long)iVar3;
    if (bVar6) {
      lVar5 = CONCAT44(extraout_var,iVar3);
    }
    if (1 < lVar5 + 1U) {
      pEVar1 = (this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
               super_ExeElementWrapper.m_Exe;
      if (pEVar1 == (Executable *)0x0) {
        lVar4 = 4;
      }
      else {
        iVar3 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xb])();
        lVar4 = (ulong)(iVar3 == 0x40) * 4 + 4;
      }
      pEVar1 = (this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
               super_ExeElementWrapper.m_Exe;
      iVar3 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0x18])
                        (pEVar1,(this->super_ImportBaseFuncWrapper).super_PENodeWrapper.
                                super_ExeNodeWrapper.entryNum * lVar4 + lVar5,2,0);
      pEVar1 = (this->super_ImportBaseFuncWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
               super_ExeElementWrapper.m_Exe;
      iVar3 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[7])
                        (pEVar1,CONCAT44(extraout_var_00,iVar3),lVar4,0);
      return (void *)CONCAT44(extraout_var_01,iVar3);
    }
  }
  return (void *)0x0;
}

Assistant:

void* ImportedFuncWrapper::getValuePtr(ImportEntryWrapper::FieldID fId)
{
    if (!parentNode) return NULL;
    bool is64 = isBit64();

    bool isOk;
    uint64_t thunkRva = parentNode->getNumValue(fId, &isOk);
    if (!isOk) {
        //printf("Failed getting value!\n");
        return NULL;
    }
    if (!is64) thunkRva = (int32_t)(thunkRva);
    if (thunkRva == 0 || thunkRva == -1) return NULL;

    bufsize_t thunkValSize = this->getThunkValSize();
    offset_t offset = static_cast<offset_t>(this->entryNum) * thunkValSize;

    offset_t thunkAddr = m_Exe->toRaw(thunkRva + offset, Executable::RVA);
    void* thunkPtr = m_Exe->getContentAt(thunkAddr, thunkValSize);
    return thunkPtr;
}